

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::RenderVertexStorageBuffer::submit
          (RenderVertexStorageBuffer *this,SubmitContext *context)

{
  deUint64 dVar1;
  Context *this_00;
  DeviceInterface *pDVar2;
  VkCommandBuffer pVVar3;
  Handle<(vk::HandleType)18> *pHVar4;
  size_type sVar5;
  Handle<(vk::HandleType)16> *pHVar6;
  reference pvVar7;
  ulong local_70;
  size_t size;
  size_t descriptorSetNdx;
  VkCommandBuffer commandBuffer;
  DeviceInterface *vkd;
  SubmitContext *context_local;
  RenderVertexStorageBuffer *this_local;
  
  this_00 = SubmitContext::getContext(context);
  pDVar2 = Context::getDeviceInterface(this_00);
  pVVar3 = SubmitContext::getCommandBuffer(context);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&this->m_resources);
  (*pDVar2->_vptr_DeviceInterface[0x4c])(pDVar2,pVVar3,0,pHVar4->m_internal);
  size = 0;
  while( true ) {
    sVar5 = std::
            vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
            ::size(&this->m_descriptorSets);
    if (sVar5 <= size) break;
    if (this->m_bufferSize < (size + 1) * 0x10000000) {
      local_70 = this->m_bufferSize + size * -0x10000000;
    }
    else {
      local_70 = 0x10000000;
    }
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                       (&(this->m_resources).pipelineLayout.
                         super_RefBase<vk::Handle<(vk::HandleType)16>_>);
    dVar1 = pHVar6->m_internal;
    pvVar7 = std::
             vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
             ::operator[](&this->m_descriptorSets,size);
    (*pDVar2->_vptr_DeviceInterface[0x56])(pDVar2,pVVar3,0,dVar1,0,1,pvVar7,0,0);
    (*pDVar2->_vptr_DeviceInterface[0x59])(pDVar2,pVVar3,local_70 >> 1 & 0xffffffff,1);
    size = size + 1;
  }
  return;
}

Assistant:

void RenderVertexStorageBuffer::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd				= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	commandBuffer	= context.getCommandBuffer();

	vkd.cmdBindPipeline(commandBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_resources.pipeline);

	for (size_t descriptorSetNdx = 0; descriptorSetNdx < m_descriptorSets.size(); descriptorSetNdx++)
	{
		const size_t size	= m_bufferSize < (descriptorSetNdx + 1) * MAX_STORAGE_BUFFER_SIZE
							? (size_t)(m_bufferSize - descriptorSetNdx * MAX_STORAGE_BUFFER_SIZE)
							: (size_t)(MAX_STORAGE_BUFFER_SIZE);

		vkd.cmdBindDescriptorSets(commandBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_resources.pipelineLayout, 0u, 1u, &m_descriptorSets[descriptorSetNdx], 0u, DE_NULL);
		vkd.cmdDraw(commandBuffer, (deUint32)(size / 2), 1, 0, 0);
	}
}